

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

SorterRecord * vdbeSorterMerge(SortSubtask *pTask,SorterRecord *p1,SorterRecord *p2)

{
  int iVar1;
  SorterRecord *in_RDX;
  SorterRecord *in_RSI;
  long in_RDI;
  int res;
  int bCached;
  SorterRecord **pp;
  SorterRecord *pFinal;
  undefined4 local_2c;
  anon_union_8_2_0134e7e8_for_u *local_28;
  anon_union_8_2_0134e7e8_for_u local_20;
  SorterRecord *local_18;
  SorterRecord *local_10;
  long local_8;
  
  local_20.pNext = (SorterRecord *)0x0;
  local_28 = &local_20;
  local_2c = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  do {
    while (iVar1 = (**(code **)(local_8 + 0x40))
                             (local_8,&local_2c,local_10 + 1,local_10->nVal,local_18 + 1,
                              local_18->nVal), 0 < iVar1) {
      local_28->pNext = local_18;
      local_28 = &local_18->u;
      local_18 = (local_18->u).pNext;
      local_2c = 0;
      if (local_18 == (SorterRecord *)0x0) {
        local_28->pNext = local_10;
        return local_20.pNext;
      }
    }
    local_28->pNext = local_10;
    local_28 = &local_10->u;
    local_10 = (local_10->u).pNext;
  } while (local_10 != (SorterRecord *)0x0);
  local_28->pNext = local_18;
  return local_20.pNext;
}

Assistant:

static SorterRecord *vdbeSorterMerge(
  SortSubtask *pTask,             /* Calling thread context */
  SorterRecord *p1,               /* First list to merge */
  SorterRecord *p2                /* Second list to merge */
){
  SorterRecord *pFinal = 0;
  SorterRecord **pp = &pFinal;
  int bCached = 0;

  assert( p1!=0 && p2!=0 );
  for(;;){
    int res;
    res = pTask->xCompare(
        pTask, &bCached, SRVAL(p1), p1->nVal, SRVAL(p2), p2->nVal
    );

    if( res<=0 ){
      *pp = p1;
      pp = &p1->u.pNext;
      p1 = p1->u.pNext;
      if( p1==0 ){
        *pp = p2;
        break;
      }
    }else{
      *pp = p2;
      pp = &p2->u.pNext;
      p2 = p2->u.pNext;
      bCached = 0;
      if( p2==0 ){
        *pp = p1;
        break;
      }
    }
  }
  return pFinal;
}